

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O1

int nn_ipc_optset_getopt(nn_optset *self,int option,void *optval,size_t *optvallen)

{
  undefined4 uVar1;
  size_t sVar2;
  
  if (option == 3) {
    uVar1 = *(undefined4 *)((long)&self[2].vfptr + 4);
  }
  else {
    if (option != 2) {
      if (option != 1) {
        return -0x5c;
      }
      *(nn_optset_vfptr **)optval = self[1].vfptr;
      sVar2 = 8;
      goto LAB_001a39ff;
    }
    uVar1 = *(undefined4 *)&self[2].vfptr;
  }
  *(undefined4 *)optval = uVar1;
  sVar2 = 4;
LAB_001a39ff:
  *optvallen = sVar2;
  return 0;
}

Assistant:

static int nn_ipc_optset_getopt (struct nn_optset *self, int option,
    void *optval, size_t *optvallen)
{
    struct nn_ipc_optset *optset;

    optset = nn_cont (self, struct nn_ipc_optset, base);

    switch (option) {
    case NN_IPC_SEC_ATTR: 
        memcpy(optval, &optset->sec_attr, sizeof(optset->sec_attr));
        *optvallen = sizeof(optset->sec_attr);
        return 0;
    case NN_IPC_OUTBUFSZ:
        *(int *)optval = optset->outbuffersz;
        *optvallen = sizeof (int);
        return 0;
    case NN_IPC_INBUFSZ:
        *(int *)optval = optset->inbuffersz;
        *optvallen = sizeof (int);
        return 0;
    default:
        return -ENOPROTOOPT;
    }
}